

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::LoadObj(attrib_t *attrib,
                     vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *shapes,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     string *err,istream *inStream,MaterialReader *readMatFn,bool triangulate)

{
  byte bVar1;
  byte bVar2;
  pointer pvVar3;
  pointer pfVar4;
  pointer pfVar5;
  pointer pfVar6;
  pointer pfVar7;
  pointer pfVar8;
  pointer pfVar9;
  pointer pfVar10;
  pointer pfVar11;
  pointer pfVar12;
  pointer pfVar13;
  pointer pfVar14;
  pointer pfVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  pointer pvVar17;
  _Alloc_hider _Var18;
  pointer piVar19;
  bool bVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  size_t sVar26;
  iterator iVar27;
  mapped_type *pmVar28;
  ulong uVar29;
  char **token;
  char **extraout_RDX;
  char **extraout_RDX_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  char **extraout_RDX_01;
  char **ppcVar30;
  char **extraout_RDX_02;
  mapped_type mVar31;
  byte *pbVar32;
  long lVar33;
  int iVar34;
  byte *pbVar35;
  ulong uVar36;
  size_t i;
  size_type sVar37;
  size_type __new_size;
  size_t i_1;
  real_t rVar38;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  byte *local_588;
  int local_57c;
  vertex_index vi;
  undefined4 uStack_56c;
  real_t r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_550;
  real_t z;
  undefined4 uStack_544;
  pointer pbStack_540;
  pointer local_538;
  vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  faceGroup;
  _Vector_base<float,_std::allocator<float>_> local_508;
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> *local_4e8;
  real_t b;
  real_t g;
  _Vector_base<float,_std::allocator<float>_> local_4d8;
  _Vector_base<float,_std::allocator<float>_> local_4b8;
  _Vector_base<float,_std::allocator<float>_> local_498;
  MaterialReader *local_480;
  ulong local_478;
  istream *local_470;
  string linebuf;
  vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_> tags;
  string name;
  real_t x;
  undefined4 uStack_3f4;
  pointer pvStack_3f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e8;
  vector<int,_std::allocator<int>_> local_3d8;
  vector<float,_std::allocator<float>_> vStack_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3a8;
  pointer paStack_390;
  pointer local_388;
  pointer paStack_380;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  shape_t shape;
  stringstream errss;
  
  local_4e8 = shapes;
  local_480 = readMatFn;
  local_470 = inStream;
  std::__cxx11::stringstream::stringstream((stringstream *)&errss);
  local_508._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_508._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_508._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_498._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_498._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_498._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  faceGroup.
  super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &material_map._M_t._M_impl.super__Rb_tree_header._M_header;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  faceGroup.
  super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  faceGroup.
  super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  shape.name._M_dataplus._M_p = (pointer)&shape.name.field_2;
  shape.name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  shape.name.field_2._M_local_buf[0] = '\0';
  shape.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  shape.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  shape.mesh.indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shape.mesh.num_face_vertices.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  shape.mesh.num_face_vertices.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  shape.mesh.num_face_vertices.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shape.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shape.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shape.mesh.material_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shape.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  linebuf._M_dataplus._M_p = (pointer)&linebuf.field_2;
  linebuf._M_string_length = 0;
  shape.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shape.mesh.tags.super__Vector_base<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  linebuf.field_2._M_local_buf[0] = '\0';
  local_57c = -1;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
LAB_0011b0c2:
  do {
    do {
      iVar21 = std::istream::peek();
      if (iVar21 == -1) {
        bVar20 = exportFaceGroupToShape(&shape,&faceGroup,&tags,local_57c,&name,triangulate);
        if ((bVar20) ||
           (shape.mesh.indices.
            super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            shape.mesh.indices.
            super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_start)) {
          std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::push_back
                    (local_4e8,&shape);
        }
        std::
        vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
        ::clear(&faceGroup);
        if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::__cxx11::stringbuf::str();
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x);
          std::__cxx11::string::~string((string *)&x);
        }
        pfVar4 = (attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_508._M_impl.super__Vector_impl_data._M_end_of_storage;
        pfVar8 = (attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar9 = (attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        (attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = local_508._M_impl.super__Vector_impl_data._M_start;
        (attrib->vertices).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = local_508._M_impl.super__Vector_impl_data._M_finish;
        pfVar5 = (attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_498._M_impl.super__Vector_impl_data._M_end_of_storage;
        pfVar10 = (attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pfVar11 = (attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        (attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = local_498._M_impl.super__Vector_impl_data._M_start;
        (attrib->normals).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = local_498._M_impl.super__Vector_impl_data._M_finish;
        pfVar6 = (attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_4b8._M_impl.super__Vector_impl_data._M_end_of_storage;
        pfVar12 = (attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pfVar13 = (attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        (attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = local_4b8._M_impl.super__Vector_impl_data._M_start;
        (attrib->texcoords).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = local_4b8._M_impl.super__Vector_impl_data._M_finish;
        pfVar7 = (attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_4d8._M_impl.super__Vector_impl_data._M_end_of_storage;
        pfVar14 = (attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pfVar15 = (attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        (attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start = local_4d8._M_impl.super__Vector_impl_data._M_start;
        (attrib->colors).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish = local_4d8._M_impl.super__Vector_impl_data._M_finish;
        local_508._M_impl.super__Vector_impl_data._M_start = pfVar8;
        local_508._M_impl.super__Vector_impl_data._M_finish = pfVar9;
        local_508._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar4;
        local_4d8._M_impl.super__Vector_impl_data._M_start = pfVar14;
        local_4d8._M_impl.super__Vector_impl_data._M_finish = pfVar15;
        local_4d8._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar7;
        local_4b8._M_impl.super__Vector_impl_data._M_start = pfVar12;
        local_4b8._M_impl.super__Vector_impl_data._M_finish = pfVar13;
        local_4b8._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar6;
        local_498._M_impl.super__Vector_impl_data._M_start = pfVar10;
        local_498._M_impl.super__Vector_impl_data._M_finish = pfVar11;
        local_498._M_impl.super__Vector_impl_data._M_end_of_storage = pfVar5;
LAB_0011bf09:
        std::__cxx11::string::~string((string *)&linebuf);
        anon_struct_128_2_9bb102e5::~shape_t(&shape);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::~_Rb_tree(&material_map._M_t);
        std::__cxx11::string::~string((string *)&name);
        std::
        vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
        ::~vector(&faceGroup);
        std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::~vector(&tags);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_4d8);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_4b8);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_498);
        std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_508);
        std::__cxx11::stringstream::~stringstream((stringstream *)&errss);
        return iVar21 == -1;
      }
      safeGetline(local_470,&linebuf);
    } while (((linebuf._M_string_length == 0) ||
             ((linebuf._M_dataplus._M_p[linebuf._M_string_length - 1] == '\n' &&
              (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               erase(&linebuf,linebuf._M_string_length - 1,0xffffffffffffffff),
              linebuf._M_string_length == 0)))) ||
            ((linebuf._M_dataplus._M_p[linebuf._M_string_length - 1] == '\r' &&
             (std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                        (&linebuf,linebuf._M_string_length - 1,0xffffffffffffffff),
             linebuf._M_string_length == 0))));
    _Var18._M_p = linebuf._M_dataplus._M_p;
    sVar26 = strspn(linebuf._M_dataplus._M_p," \t");
    pbVar35 = (byte *)(_Var18._M_p + sVar26);
    local_588 = pbVar35;
    if (_Var18._M_p == (pointer)0x0) {
      __assert_fail("token",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/tinyobjloader/tiny_obj_loader.h"
                    ,0x620,
                    "bool tinyobj::LoadObj(attrib_t *, std::vector<shape_t> *, std::vector<material_t> *, std::string *, std::istream *, MaterialReader *, bool)"
                   );
    }
    bVar1 = *pbVar35;
    if (bVar1 != 0x66) break;
    if ((pbVar35[1] != 0x20) && (pbVar35[1] != 9)) goto LAB_0011b647;
    local_588 = pbVar35 + 2;
    local_550 = err;
    sVar26 = strspn((char *)local_588," \t");
    pbVar35 = pbVar35 + sVar26 + 2;
    _x = (pointer)0x0;
    pvStack_3f0 = (pointer)0x0;
    local_3e8._M_allocated_capacity = 0;
    local_588 = pbVar35;
    std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::reserve
              ((vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)&x,3);
    while ((0xd < *pbVar35 || ((0x2401U >> (*pbVar35 & 0x1f) & 1) == 0))) {
      vi.v_idx = -1;
      vi.vt_idx = -1;
      stack0xfffffffffffffa90 = CONCAT44(uStack_56c,0xffffffff);
      local_478 = (ulong)((long)local_498._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_498._M_impl.super__Vector_impl_data._M_start >> 2) / 3;
      uVar36 = (long)local_4b8._M_impl.super__Vector_impl_data._M_finish -
               (long)local_4b8._M_impl.super__Vector_impl_data._M_start;
      iVar22 = atoi((char *)pbVar35);
      iVar25 = -1;
      if (iVar22 < 1) {
        if (iVar22 != 0) {
          iVar25 = (int)((ulong)((long)local_508._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_508._M_impl.super__Vector_impl_data._M_start >> 2) / 3)
          ;
          goto LAB_0011b2a7;
        }
LAB_0011bfb0:
        if (local_550 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (local_550,"Failed parse `f\' line(e.g. zero value for face index).\n");
        }
        std::_Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::
        ~_Vector_base((_Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *
                      )&x);
        goto LAB_0011bf09;
      }
LAB_0011b2a7:
      sVar26 = strcspn((char *)pbVar35,"/ \t\r");
      pbVar32 = pbVar35 + sVar26;
      if (pbVar35[sVar26] == 0x2f) {
        if (pbVar32[1] == 0x2f) {
          pbVar32 = pbVar32 + 2;
          iVar23 = atoi((char *)pbVar32);
          iVar34 = -1;
          if ((0 < iVar23) || (iVar34 = (int)local_478, iVar23 != 0)) {
            iVar34 = iVar34 + iVar23;
            iVar23 = -1;
LAB_0011b362:
            sVar26 = strcspn((char *)pbVar32,"/ \t\r");
            pbVar32 = pbVar32 + sVar26;
            goto LAB_0011b37c;
          }
        }
        else {
          pbVar35 = pbVar32 + 1;
          iVar24 = atoi((char *)pbVar35);
          iVar23 = -1;
          if ((0 < iVar24) || (iVar23 = (int)(uVar36 >> 3), iVar24 != 0)) {
            iVar23 = iVar23 + iVar24;
            sVar26 = strcspn((char *)pbVar35,"/ \t\r");
            pbVar32 = pbVar35 + sVar26;
            if (pbVar35[sVar26] != 0x2f) goto LAB_0011b2f5;
            pbVar32 = pbVar32 + 1;
            iVar24 = atoi((char *)pbVar32);
            iVar34 = -1;
            if ((0 < iVar24) || (iVar34 = (int)local_478, iVar24 != 0)) {
              iVar34 = iVar34 + iVar24;
              goto LAB_0011b362;
            }
          }
        }
        goto LAB_0011bfb0;
      }
      iVar23 = -1;
LAB_0011b2f5:
      iVar34 = -1;
LAB_0011b37c:
      vi.vt_idx = iVar23;
      vi.v_idx = iVar25 + iVar22;
      stack0xfffffffffffffa90 = CONCAT44(uStack_56c,iVar34);
      std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::push_back
                ((vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)&x,&vi);
      sVar26 = strspn((char *)pbVar32," \t\r");
      pbVar35 = pbVar32 + sVar26;
    }
    vi.v_idx = 0;
    vi.vt_idx = 0;
    stack0xfffffffffffffa90 = 0;
    std::
    vector<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>,std::allocator<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>>>
    ::emplace_back<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>>
              ((vector<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>,std::allocator<std::vector<tinyobj::vertex_index,std::allocator<tinyobj::vertex_index>>>>
                *)&faceGroup,
               (vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)&vi);
    std::_Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::~_Vector_base
              ((_Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)&vi);
    pvVar3 = faceGroup.
             super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    in_XMM1_Da = *(undefined4 *)
                  &faceGroup.
                   super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    in_XMM1_Db = *(undefined4 *)
                  ((long)&faceGroup.
                          super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].
                          super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)faceGroup.
                 super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
                 _M_impl.super__Vector_impl_data._M_start;
    pvVar17 = faceGroup.
              super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].
              super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    faceGroup.
    super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].
    super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)_x;
    faceGroup.
    super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].
    super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>._M_impl.
    super__Vector_impl_data._M_finish = pvStack_3f0;
    faceGroup.
    super__Vector_base<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].
    super__Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_3e8._M_allocated_capacity;
    _x = (pointer)paVar16;
    pvStack_3f0 = pvVar17;
    local_3e8._M_allocated_capacity = (size_type)pvVar3;
    std::_Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>::~_Vector_base
              ((_Vector_base<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_> *)&x);
    err = local_550;
  } while( true );
  if ((bVar1 == 0) || (bVar1 == 0x23)) goto LAB_0011b0c2;
  if (bVar1 == 0x76) {
    bVar2 = pbVar35[1];
    if (bVar2 == 9) {
LAB_0011b47b:
      local_588 = pbVar35 + 2;
      rVar38 = parseReal((char **)&local_588,0.0);
      x = rVar38;
      rVar38 = parseReal((char **)&local_588,0.0);
      vi.v_idx = (int)rVar38;
      rVar38 = parseReal((char **)&local_588,0.0);
      _z = (pointer)CONCAT44(uStack_544,rVar38);
      r = parseReal((char **)&local_588,1.0);
      g = parseReal((char **)&local_588,1.0);
      b = parseReal((char **)&local_588,1.0);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)&local_508,&x);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)&local_508,(value_type_conflict4 *)&vi);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)&local_508,&z);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)&local_4d8,&r);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)&local_4d8,&g);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)&local_4d8,&b);
      goto LAB_0011b0c2;
    }
    if (bVar2 == 0x74) {
      if ((pbVar35[2] == 0x20) || (pbVar35[2] == 9)) {
        local_588 = pbVar35 + 3;
        parseReal2(&x,(real_t *)&vi,(char **)&local_588,0.0,(double)CONCAT44(in_XMM1_Db,in_XMM1_Da))
        ;
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&local_4b8,&x);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&local_4b8,(value_type_conflict4 *)&vi);
        goto LAB_0011b0c2;
      }
    }
    else if (bVar2 == 0x6e) {
      if ((pbVar35[2] == 0x20) || (pbVar35[2] == 9)) {
        local_588 = pbVar35 + 3;
        in_XMM1_Da = 0;
        in_XMM1_Db = 0;
        parseReal3(&x,(real_t *)&vi,&z,(char **)&local_588,0.0,0.0,0.0);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&local_498,&x);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&local_498,(value_type_conflict4 *)&vi);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)&local_498,&z);
        goto LAB_0011b0c2;
      }
    }
    else if (bVar2 == 0x20) goto LAB_0011b47b;
  }
LAB_0011b647:
  iVar21 = strncmp((char *)pbVar35,"usemtl",6);
  if ((iVar21 == 0) && ((pbVar35[6] == 0x20 || (pbVar35[6] == 9)))) {
    local_588 = pbVar35 + 7;
    std::__cxx11::stringstream::stringstream((stringstream *)&x);
    std::operator<<((ostream *)local_3e8._M_local_buf,(char *)(pbVar35 + 7));
    std::__cxx11::stringbuf::str();
    iVar27 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&material_map._M_t,(key_type *)&vi);
    mVar31 = -1;
    if ((_Rb_tree_header *)iVar27._M_node != &material_map._M_t._M_impl.super__Rb_tree_header) {
      pmVar28 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[](&material_map,(key_type *)&vi);
      mVar31 = *pmVar28;
    }
    if (mVar31 != local_57c) {
      exportFaceGroupToShape(&shape,&faceGroup,&tags,local_57c,&name,triangulate);
      std::
      vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
      ::clear(&faceGroup);
      local_57c = mVar31;
    }
  }
  else {
    iVar21 = strncmp((char *)pbVar35,"mtllib",6);
    if ((iVar21 == 0) && ((pbVar35[6] == 0x20 || (pbVar35[6] == 9)))) {
      if (local_480 != (MaterialReader *)0x0) {
        local_588 = pbVar35 + 7;
        _z = (pointer)0x0;
        pbStack_540 = (pointer)0x0;
        local_538 = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&x,(char *)local_588,(allocator<char> *)&vi);
        SplitString((string *)&x,(char)&z,elems);
        std::__cxx11::string::~string((string *)&x);
        if (_z == pbStack_540) {
          if (err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (err,"WARN: Looks like empty filename for mtllib. Use default material. \n");
          }
        }
        else {
          uVar36 = 0xffffffffffffffff;
          lVar33 = 0;
          do {
            uVar29 = (long)pbStack_540 - (long)_z >> 5;
            uVar36 = uVar36 + 1;
            if (uVar29 <= uVar36) {
              if ((err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                 && (uVar29 <= uVar36)) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(err,"WARN: Failed to load material file(s). Use default material.\n");
              }
              break;
            }
            _x = (pointer)&local_3e8;
            pvStack_3f0 = (pointer)0x0;
            local_3e8._M_allocated_capacity = local_3e8._M_allocated_capacity & 0xffffffffffffff00;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vi,*(char **)((long)&(_z->_M_dataplus)._M_p + lVar33),
                       (allocator<char> *)&r);
            iVar21 = (*local_480->_vptr_MaterialReader[2])(local_480,&vi,materials,&material_map,&x)
            ;
            std::__cxx11::string::~string((string *)&vi);
            if ((err != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
               (pvStack_3f0 != (pointer)0x0)) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x);
            }
            lVar33 = lVar33 + 0x20;
            std::__cxx11::string::~string((string *)&x);
          } while ((char)iVar21 == '\0');
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&z);
      }
      goto LAB_0011b0c2;
    }
    if (bVar1 == 0x74) {
      if ((pbVar35[1] == 0x20) || (pbVar35[1] == 9)) {
        _x = (pointer)&local_3e8;
        pvStack_3f0 = (pointer)0x0;
        local_3e8._M_allocated_capacity = local_3e8._M_allocated_capacity & 0xffffffffffffff00;
        local_3a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_3c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        vStack_3c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        local_3a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        vStack_3c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_588 = pbVar35 + 2;
        parseString_abi_cxx11_((string *)&vi,(tinyobj *)&local_588,token);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x,
                   (string *)&vi);
        std::__cxx11::string::~string((string *)&vi);
        pbVar32 = local_588;
        sVar26 = strspn((char *)local_588," \t");
        pbVar32 = pbVar32 + sVar26;
        iVar21 = atoi((char *)pbVar32);
        sVar26 = strcspn((char *)pbVar32,"/ \t\r");
        pbVar35 = pbVar32 + sVar26;
        local_588 = pbVar35;
        if (pbVar32[sVar26] == 0x2f) {
          sVar26 = strspn((char *)(pbVar35 + 1)," \t");
          pbVar35 = pbVar35 + sVar26 + 1;
          iVar22 = atoi((char *)pbVar35);
          sVar26 = strcspn((char *)pbVar35,"/ \t\r");
          if (pbVar35[sVar26] == 0x2f) {
            local_588 = pbVar35 + sVar26 + 1;
            iVar25 = parseInt((char **)&local_588);
            __new_size = (size_type)iVar25;
          }
          else {
            __new_size = 0;
            local_588 = pbVar35 + sVar26;
          }
        }
        else {
          __new_size = 0;
          iVar22 = 0;
        }
        std::vector<int,_std::allocator<int>_>::resize(&local_3d8,(long)iVar21);
        piVar19 = local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_550 = err;
        for (sVar37 = 0; (long)iVar21 != sVar37; sVar37 = sVar37 + 1) {
          iVar25 = parseInt((char **)&local_588);
          piVar19[sVar37] = iVar25;
        }
        std::vector<float,_std::allocator<float>_>::resize(&vStack_3c0,(long)iVar22);
        err = local_550;
        for (sVar37 = 0; (long)iVar22 != sVar37; sVar37 = sVar37 + 1) {
          rVar38 = parseReal((char **)&local_588,0.0);
          vStack_3c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[sVar37] = rVar38;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize(&local_3a8,__new_size);
        lVar33 = 0;
        ppcVar30 = extraout_RDX_01;
        while (bVar20 = __new_size != 0, __new_size = __new_size - 1, bVar20) {
          parseString_abi_cxx11_((string *)&vi,(tinyobj *)&local_588,ppcVar30);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((local_3a8.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar33),(string *)&vi);
          std::__cxx11::string::~string((string *)&vi);
          lVar33 = lVar33 + 0x20;
          ppcVar30 = extraout_RDX_02;
        }
        std::vector<tinyobj::tag_t,_std::allocator<tinyobj::tag_t>_>::push_back
                  (&tags,(value_type *)&x);
        anon_struct_104_4_4d5e477a::~tag_t((anon_struct_104_4_4d5e477a *)&x);
      }
      goto LAB_0011b0c2;
    }
    if (bVar1 != 0x6f) {
      if ((bVar1 == 0x67) && ((pbVar35[1] == 0x20 || (pbVar35[1] == 9)))) {
        exportFaceGroupToShape(&shape,&faceGroup,&tags,local_57c,&name,triangulate);
        if (shape.mesh.indices.
            super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            shape.mesh.indices.
            super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
            super__Vector_impl_data._M_start) {
          std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::push_back
                    (local_4e8,&shape);
        }
        _x = (pointer)&local_3e8;
        local_3e8._M_allocated_capacity = 0;
        local_3e8._8_8_ = 0;
        pvStack_3f0 = (pointer)0x0;
        local_388 = (pointer)0x0;
        paStack_380 = (pointer)0x0;
        local_3a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        paStack_390 = (pointer)0x0;
        local_3a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_3a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_3c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        vStack_3c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        vStack_3c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        anon_struct_128_2_9bb102e5::operator=(&shape,(anon_struct_128_2_9bb102e5 *)&x);
        anon_struct_128_2_9bb102e5::~shape_t((anon_struct_128_2_9bb102e5 *)&x);
        std::
        vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
        ::clear(&faceGroup);
        vi.v_idx = 0;
        vi.vt_idx = 0;
        stack0xfffffffffffffa90 = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&vi,2);
        ppcVar30 = extraout_RDX;
        while ((0xd < *pbVar35 || ((0x2401U >> (*pbVar35 & 0x1f) & 1) == 0))) {
          parseString_abi_cxx11_((string *)&x,(tinyobj *)&local_588,ppcVar30);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&vi,(string *)&x);
          pbVar35 = local_588;
          sVar26 = strspn((char *)local_588," \t\r");
          pbVar35 = pbVar35 + sVar26;
          local_588 = pbVar35;
          std::__cxx11::string::~string((string *)&x);
          ppcVar30 = extraout_RDX_00;
        }
        if (stack0xfffffffffffffa90 == vi._0_8_) {
          __assert_fail("names.size() > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/tinyobjloader/tiny_obj_loader.h"
                        ,0x6c8,
                        "bool tinyobj::LoadObj(attrib_t *, std::vector<shape_t> *, std::vector<material_t> *, std::string *, std::istream *, MaterialReader *, bool)"
                       );
        }
        if (stack0xfffffffffffffa90 - vi._0_8_ < 0x21) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (&name,"");
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (vi._0_8_ + 0x20));
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&vi);
      }
      goto LAB_0011b0c2;
    }
    if ((pbVar35[1] != 0x20) && (pbVar35[1] != 9)) goto LAB_0011b0c2;
    bVar20 = exportFaceGroupToShape(&shape,&faceGroup,&tags,local_57c,&name,triangulate);
    if (bVar20) {
      std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::push_back(local_4e8,&shape);
    }
    std::
    vector<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>,_std::allocator<std::vector<tinyobj::vertex_index,_std::allocator<tinyobj::vertex_index>_>_>_>
    ::clear(&faceGroup);
    _x = (pointer)&local_3e8;
    local_3e8._M_allocated_capacity = 0;
    local_3e8._8_8_ = 0;
    pvStack_3f0 = (pointer)0x0;
    local_388 = (pointer)0x0;
    paStack_380 = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paStack_390 = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_3c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_3c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vStack_3c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_3d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    anon_struct_128_2_9bb102e5::operator=(&shape,(anon_struct_128_2_9bb102e5 *)&x);
    anon_struct_128_2_9bb102e5::~shape_t((anon_struct_128_2_9bb102e5 *)&x);
    local_588 = pbVar35 + 2;
    std::__cxx11::stringstream::stringstream((stringstream *)&x);
    std::operator<<((ostream *)local_3e8._M_local_buf,(char *)(pbVar35 + 2));
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vi);
  }
  std::__cxx11::string::~string((string *)&vi);
  std::__cxx11::stringstream::~stringstream((stringstream *)&x);
  goto LAB_0011b0c2;
}

Assistant:

bool LoadObj(attrib_t *attrib, std::vector<shape_t> *shapes,
             std::vector<material_t> *materials, std::string *err,
             std::istream *inStream, MaterialReader *readMatFn /*= NULL*/,
             bool triangulate) {
  std::stringstream errss;

  std::vector<real_t> v;
  std::vector<real_t> vn;
  std::vector<real_t> vt;
  std::vector<real_t> vc;
  std::vector<tag_t> tags;
  std::vector<std::vector<vertex_index> > faceGroup;
  std::string name;

  // material
  std::map<std::string, int> material_map;
  int material = -1;

  shape_t shape;

  std::string linebuf;
  while (inStream->peek() != -1) {
    safeGetline(*inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      real_t x, y, z;
      real_t r, g, b;
      parseVertexWithColor(&x, &y, &z, &r, &g, &b, &token);
      v.push_back(x);
      v.push_back(y);
      v.push_back(z);

      vc.push_back(r);
      vc.push_back(g);
      vc.push_back(b);
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      vn.push_back(x);
      vn.push_back(y);
      vn.push_back(z);
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y;
      parseReal2(&x, &y, &token);
      vt.push_back(x);
      vt.push_back(y);
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      std::vector<vertex_index> face;
      face.reserve(3);

      while (!IS_NEW_LINE(token[0])) {
        vertex_index vi;
        if (!parseTriple(&token, static_cast<int>(v.size() / 3),
                         static_cast<int>(vn.size() / 3),
                         static_cast<int>(vt.size() / 2), &vi)) {
          if (err) {
            (*err) = "Failed parse `f' line(e.g. zero value for face index).\n";
          }
          return false;
        }

        face.push_back(vi);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      // replace with emplace_back + std::move on C++11
      faceGroup.push_back(std::vector<vertex_index>());
      faceGroup[faceGroup.size() - 1].swap(face);

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      if (material_map.find(namebuf) != material_map.end()) {
        newMaterialId = material_map[namebuf];
      } else {
        // { error!! material not found }
      }

      if (newMaterialId != material) {
        // Create per-face material. Thus we don't add `shape` to `shapes` at
        // this time.
        // just clear `faceGroup` after `exportFaceGroupToShape()` call.
        exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                               triangulate);
        faceGroup.clear();
        material = newMaterialId;
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', filenames);

        if (filenames.empty()) {
          if (err) {
            (*err) +=
                "WARN: Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), materials,
                                   &material_map, &err_mtl);
            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;  // This should be warn message.
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (err) {
              (*err) +=
                  "WARN: Failed to load material file(s). Use default "
                  "material.\n";
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      // flush previous face group.
      bool ret = exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                                        triangulate);
      (void)ret;  // return value not used.

      if (shape.mesh.indices.size() > 0) {
        shapes->push_back(shape);
      }

      shape = shape_t();

      // material = -1;
      faceGroup.clear();

      std::vector<std::string> names;
      names.reserve(2);

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      // names[0] must be 'g', so skip the 0th element.
      if (names.size() > 1) {
        name = names[1];
      } else {
        name = "";
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // flush previous face group.
      bool ret = exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                                        triangulate);
      if (ret) {
        shapes->push_back(shape);
      }

      // material = -1;
      faceGroup.clear();
      shape = shape_t();

      // @todo { multiple object name? }
      token += 2;
      std::stringstream ss;
      ss << token;
      name = ss.str();

      continue;
    }

    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;

      tag.name = parseString(&token);

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = parseInt(&token);
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        tag.stringValues[i] = parseString(&token);
      }

      tags.push_back(tag);
    }

    // Ignore unknown command.
  }

  bool ret = exportFaceGroupToShape(&shape, faceGroup, tags, material, name,
                                    triangulate);
  // exportFaceGroupToShape return false when `usemtl` is called in the last
  // line.
  // we also add `shape` to `shapes` when `shape.mesh` has already some
  // faces(indices)
  if (ret || shape.mesh.indices.size()) {
    shapes->push_back(shape);
  }
  faceGroup.clear();  // for safety

  if (err) {
    (*err) += errss.str();
  }

  attrib->vertices.swap(v);
  attrib->normals.swap(vn);
  attrib->texcoords.swap(vt);
  attrib->colors.swap(vc);

  return true;
}